

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O2

void __thiscall
dg::DGLLVMPointerAnalysis::DGLLVMPointerAnalysis
          (DGLLVMPointerAnalysis *this,Module *m,LLVMPointerAnalysisOptions *opts)

{
  LLVMPointerGraphBuilder *this_00;
  LLVMPointerAnalysisOptions local_90;
  
  LLVMPointerAnalysisOptions::LLVMPointerAnalysisOptions(&local_90,opts);
  LLVMPointerAnalysis::LLVMPointerAnalysis(&this->super_LLVMPointerAnalysis,&local_90);
  LLVMPointerAnalysisOptions::~LLVMPointerAnalysisOptions(&local_90);
  (this->super_LLVMPointerAnalysis)._vptr_LLVMPointerAnalysis =
       (_func_int **)&PTR_hasPointsTo_00126770;
  this->PS = (PointerGraph *)0x0;
  (this->PTA)._M_t.
  super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>.
  _M_t.
  super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
  .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl = (PointerAnalysis *)0x0;
  this_00 = (LLVMPointerGraphBuilder *)operator_new(0x228);
  pta::LLVMPointerGraphBuilder::LLVMPointerGraphBuilder(this_00,m,opts);
  (this->_builder)._M_t.
  super___uniq_ptr_impl<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
  ._M_t.
  super__Tuple_impl<0UL,_dg::pta::LLVMPointerGraphBuilder_*,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
  .super__Head_base<0UL,_dg::pta::LLVMPointerGraphBuilder_*,_false>._M_head_impl = this_00;
  return;
}

Assistant:

DGLLVMPointerAnalysis(const llvm::Module *m,
                          const LLVMPointerAnalysisOptions opts)
            : LLVMPointerAnalysis(opts),
              _builder(new LLVMPointerGraphBuilder(m, opts)) {}